

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_gej_set_ge(secp256k1_gej *r,secp256k1_ge *a)

{
  void *in_RSI;
  void *in_RDI;
  
  secp256k1_ge_verify((secp256k1_ge *)0x479568);
  *(undefined4 *)((long)in_RDI + 0x78) = *(undefined4 *)((long)in_RSI + 0x50);
  memcpy(in_RDI,in_RSI,0x28);
  memcpy((void *)((long)in_RDI + 0x28),(void *)((long)in_RSI + 0x28),0x28);
  secp256k1_fe_impl_set_int((secp256k1_fe *)((long)in_RDI + 0x50),1);
  secp256k1_gej_verify((secp256k1_gej *)0x4795c5);
  return;
}

Assistant:

static void secp256k1_gej_set_ge(secp256k1_gej *r, const secp256k1_ge *a) {
   SECP256K1_GE_VERIFY(a);

   r->infinity = a->infinity;
   r->x = a->x;
   r->y = a->y;
   secp256k1_fe_set_int(&r->z, 1);

   SECP256K1_GEJ_VERIFY(r);
}